

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O3

void spawn_stdin_stdout(void)

{
  int iVar1;
  size_t __n;
  ssize_t sVar2;
  int *piVar3;
  undefined8 uVar4;
  undefined1 *__buf;
  char buf [1024];
  undefined1 auStack_418 [1024];
  
  do {
    while (__n = read(0,auStack_418,0x400), __n != 0xffffffffffffffff) {
      if (__n == 0) {
        return;
      }
      __buf = auStack_418;
      if ((long)__n < 1) goto LAB_0016f692;
      do {
        while( true ) {
          uVar4 = 1;
          sVar2 = write(1,__buf,__n);
          if (sVar2 != -1) break;
          piVar3 = __errno_location();
          if (*piVar3 != 4) {
LAB_0016f6a4:
            spawn_stdin_stdout_cold_2();
            iVar1 = uv_is_closing();
            if (iVar1 != 0) {
              return;
            }
            uv_close(uVar4,0);
            return;
          }
        }
        if (sVar2 < 0) goto LAB_0016f6a4;
        __n = __n - sVar2;
        __buf = __buf + sVar2;
      } while (__n != 0);
    }
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
LAB_0016f692:
  spawn_stdin_stdout_cold_1();
  return;
}

Assistant:

void spawn_stdin_stdout(void) {
  char buf[1024];
  char* pbuf;
  for (;;) {
    ssize_t r, w, c;
    do {
      r = read(0, buf, sizeof buf);
    } while (r == -1 && errno == EINTR);
    if (r == 0) {
      return;
    }
    ASSERT(r > 0);
    c = r;
    pbuf = buf;
    while (c) {
      do {
        w = write(1, pbuf, (size_t)c);
      } while (w == -1 && errno == EINTR);
      ASSERT(w >= 0);
      pbuf = pbuf + w;
      c = c - w;
    }
  }
}